

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_ofind(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  bool found;
  bool fAll;
  int nMatch;
  int vnum;
  OBJ_INDEX_DATA *pObjIndex;
  char arg [4608];
  char buf [4608];
  char *in_stack_ffffffffffffdbc8;
  undefined6 in_stack_ffffffffffffdbd0;
  undefined1 in_stack_ffffffffffffdbd6;
  byte bVar2;
  undefined1 in_stack_ffffffffffffdbd7;
  byte bVar3;
  undefined4 in_stack_ffffffffffffdbd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffdbdc;
  int vnum_00;
  OBJ_INDEX_DATA *in_stack_ffffffffffffdbe0;
  char local_2418;
  char local_1218 [4584];
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  one_argument((char *)CONCAT17(in_stack_ffffffffffffdbd7,
                                CONCAT16(in_stack_ffffffffffffdbd6,in_stack_ffffffffffffdbd0)),
               in_stack_ffffffffffffdbc8);
  if (local_2418 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdbe0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
  }
  else {
    bVar3 = 0;
    bVar2 = 0;
    iVar4 = 0;
    vnum_00 = 0;
    while (iVar4 < top_obj_index) {
      in_stack_ffffffffffffdbe0 = get_obj_index(vnum_00);
      if ((in_stack_ffffffffffffdbe0 != (OBJ_INDEX_DATA *)0x0) &&
         ((iVar4 = iVar4 + 1, (bVar3 & 1) != 0 ||
          (bVar1 = is_name(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0), bVar1)))) {
        bVar2 = 1;
        sprintf(local_1218,"[%5d] %s\n\r",(ulong)(uint)(int)in_stack_ffffffffffffdbe0->vnum,
                in_stack_ffffffffffffdbe0->short_descr);
        send_to_char((char *)in_stack_ffffffffffffdbe0,(CHAR_DATA *)CONCAT44(vnum_00,iVar4));
      }
      vnum_00 = vnum_00 + 1;
    }
    if ((bVar2 & 1) == 0) {
      send_to_char((char *)in_stack_ffffffffffffdbe0,(CHAR_DATA *)CONCAT44(vnum_00,iVar4));
    }
  }
  return;
}

Assistant:

void do_ofind(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pObjIndex;
	int vnum;
	int nMatch;
	bool fAll;
	bool found;

	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Find what?\n\r", ch);
		return;
	}

	fAll = false; /* !str_cmp( arg, "all" ); */
	found = false;
	nMatch = 0;

	/*
	 * Yeah, so iterating over all vnum's takes 10,000 loops.
	 * Get_obj_index is fast, and I don't feel like threading another link.
	 * Do you?
	 * -- Furey
	 */
	for (vnum = 0; nMatch < top_obj_index; vnum++)
	{
		pObjIndex = get_obj_index(vnum);

		if (pObjIndex != nullptr)
		{
			nMatch++;
			if (fAll || is_name(argument, pObjIndex->name))
			{
				found = true;
				sprintf(buf, "[%5d] %s\n\r", pObjIndex->vnum, pObjIndex->short_descr);
				send_to_char(buf, ch);
			}
		}
	}

	if (!found)
		send_to_char("No objects by that name.\n\r", ch);
}